

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

string * __thiscall
duckdb::StringifyAndFree_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,yyjson_mut_doc *doc,yyjson_mut_val *object)

{
  char *__ptr;
  InternalException *this_00;
  allocator local_41;
  string local_40;
  
  __ptr = duckdb_yyjson::yyjson_mut_val_write_opts
                    ((yyjson_mut_val *)doc,9,(yyjson_alc *)0x0,(usize *)0x0,(yyjson_write_err *)0x0)
  ;
  if (__ptr != (char *)0x0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,__ptr,(allocator *)&local_40);
    free(__ptr);
    duckdb_yyjson::yyjson_mut_doc_free((yyjson_mut_doc *)this);
    return __return_storage_ptr__;
  }
  duckdb_yyjson::yyjson_mut_doc_free((yyjson_mut_doc *)this);
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"The plan could not be rendered as JSON, yyjson failed",&local_41);
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string StringifyAndFree(yyjson_mut_doc *doc, yyjson_mut_val *object) {
	auto data = yyjson_mut_val_write_opts(object, YYJSON_WRITE_ALLOW_INF_AND_NAN | YYJSON_WRITE_PRETTY, nullptr,
	                                      nullptr, nullptr);
	if (!data) {
		yyjson_mut_doc_free(doc);
		throw InternalException("The plan could not be rendered as JSON, yyjson failed");
	}
	auto result = string(data);
	free(data);
	yyjson_mut_doc_free(doc);
	return result;
}